

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoMemoryFill(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  Memory *this_01;
  allocator local_89;
  string local_88;
  Ptr local_68;
  Enum local_50;
  u32 local_4c;
  uint local_48;
  uint dst;
  uint value;
  uint size;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  _value = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,_value);
  dst = Pop<unsigned_int>(this);
  local_48 = Pop<unsigned_int>(this);
  local_4c = Pop<unsigned_int>(this);
  this_01 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  local_50 = (Enum)Memory::Fill(this_01,local_4c,(u8)local_48,dst);
  bVar2 = Failed((Result)local_50);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,"out of bounds memory access: memory.fill out of bounds",
               &local_89);
    Trap::New(&local_68,pSVar1,&local_88,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_68);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoMemoryFill(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32]};
  auto size = Pop<u32>();
  auto value = Pop<u32>();
  auto dst = Pop<u32>();
  TRAP_IF(Failed(memory->Fill(dst, value, size)),
          "out of bounds memory access: memory.fill out of bounds");
  return RunResult::Ok;
}